

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbmain.cpp
# Opt level: O0

QPlatformIntegration * __thiscall
QXcbIntegrationPlugin::create
          (QXcbIntegrationPlugin *this,QString *system,QStringList *parameters,int *argc,char **argv
          )

{
  bool bVar1;
  int iVar2;
  int *in_RCX;
  QList *in_RDX;
  QLatin1String *in_RSI;
  char **in_R8;
  QLatin1StringView QVar3;
  QXcbIntegration *xcbIntegration;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  QPlatformIntegration *local_8;
  
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  iVar2 = QString::compare(in_RSI,(CaseSensitivity)QVar3.m_size);
  if (iVar2 == 0) {
    local_8 = (QPlatformIntegration *)operator_new(0x70);
    QXcbIntegration::QXcbIntegration((QXcbIntegration *)local_8,in_RDX,in_RCX,in_R8);
    bVar1 = QXcbIntegration::hasConnection((QXcbIntegration *)local_8);
    if (!bVar1) {
      if (local_8 != (QPlatformIntegration *)0x0) {
        (**(code **)(*(long *)local_8 + 8))();
      }
      local_8 = (QPlatformIntegration *)0x0;
    }
  }
  else {
    local_8 = (QPlatformIntegration *)0x0;
  }
  return local_8;
}

Assistant:

QPlatformIntegration* QXcbIntegrationPlugin::create(const QString& system, const QStringList& parameters, int &argc, char **argv)
{
    if (!system.compare("xcb"_L1, Qt::CaseInsensitive)) {
        auto xcbIntegration = new QXcbIntegration(parameters, argc, argv);
        if (!xcbIntegration->hasConnection()) {
            delete xcbIntegration;
            return nullptr;
        }
        return xcbIntegration;
    }

    return nullptr;
}